

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O2

Flow * __thiscall
wasm::ExpressionRunner<wasm::ModuleRunner>::visitI31Get
          (Flow *__return_storage_ptr__,ExpressionRunner<wasm::ModuleRunner> *this,I31Get *curr)

{
  bool bVar1;
  Literal *this_00;
  undefined1 local_88 [8];
  Flow flow;
  
  visit((Flow *)local_88,this,curr->i31);
  if (flow.breakTo.super_IString.str._M_len == 0) {
    this_00 = Flow::getSingleValue((Flow *)local_88);
    bVar1 = wasm::Type::isNull(&this_00->type);
    if (bVar1) {
      (*this->_vptr_ExpressionRunner[2])(this,"null ref");
    }
    flow.breakTo.super_IString.str._M_str._0_4_ = Literal::geti31(this_00,curr->signed_);
    Flow::Flow(__return_storage_ptr__,(Literal *)&flow.breakTo.super_IString.str._M_str);
    Literal::~Literal((Literal *)&flow.breakTo.super_IString.str._M_str);
  }
  else {
    Flow::Flow(__return_storage_ptr__,(Flow *)local_88);
  }
  SmallVector<wasm::Literal,_1UL>::~SmallVector((SmallVector<wasm::Literal,_1UL> *)local_88);
  return __return_storage_ptr__;
}

Assistant:

Flow visitI31Get(I31Get* curr) {
    NOTE_ENTER("I31Get");
    Flow flow = visit(curr->i31);
    if (flow.breaking()) {
      return flow;
    }
    const auto& value = flow.getSingleValue();
    NOTE_EVAL1(value);
    if (value.isNull()) {
      trap("null ref");
    }
    return Literal(value.geti31(curr->signed_));
  }